

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmLinkInterfaceLibraries * __thiscall
cmGeneratorTarget::GetLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,
          LinkInterfaceFor interfaceFor)

{
  _Base_ptr p_Var1;
  bool bVar2;
  TargetType TVar3;
  cmLinkInterface *pcVar4;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  cmLinkInterfaceLibraries *iface;
  cmLinkInterfaceLibraries *pcVar5;
  cmGeneratorTarget *local_28;
  
  local_28 = head;
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    pcVar4 = GetImportLinkInterface(this,config,local_28,interfaceFor,false);
    return &pcVar4->super_cmLinkInterfaceLibraries;
  }
  TVar3 = cmTarget::GetType(this->Target);
  if ((TVar3 == EXECUTABLE) && (bVar2 = IsExecutableWithExports(this), !bVar2)) {
    return (cmLinkInterfaceLibraries *)0x0;
  }
  if (interfaceFor == Usage) {
    this_00 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,config)->
               super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
    ;
  }
  else {
    this_00 = &GetHeadToLinkInterfaceMap(this,config)->
               super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
    ;
  }
  if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var1[4]._M_parent == '\0')) {
    local_28 = *(cmGeneratorTarget **)(p_Var1 + 1);
  }
  iface = (cmLinkInterfaceLibraries *)
          std::
          map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
          ::operator[](this_00,&local_28);
  if (*(char *)((long)&iface[2].Objects.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
    *(undefined1 *)
     ((long)&iface[2].Objects.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish + 2) = 1;
    ComputeLinkInterfaceLibraries
              (this,config,(cmOptionalLinkInterface *)iface,local_28,interfaceFor);
  }
  pcVar5 = (cmLinkInterfaceLibraries *)0x0;
  if (*(char *)((long)&iface[2].Objects.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4) != '\0') {
    pcVar5 = iface;
  }
  return pcVar5;
}

Assistant:

const cmLinkInterfaceLibraries* cmGeneratorTarget::GetLinkInterfaceLibraries(
  const std::string& config, cmGeneratorTarget const* head,
  LinkInterfaceFor interfaceFor) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, interfaceFor);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm =
    (interfaceFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head, interfaceFor);
  }

  return iface.Exists ? &iface : nullptr;
}